

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterSystem.h
# Opt level: O2

void __thiscall
DIS::ElectromagneticEmissionSystemData::setEmitterSystem
          (ElectromagneticEmissionSystemData *this,EmitterSystem *pX)

{
  uchar uVar1;
  uchar uVar2;
  
  uVar1 = pX->_function;
  uVar2 = pX->_emitterIdNumber;
  (this->_emitterSystem)._emitterName = pX->_emitterName;
  (this->_emitterSystem)._function = uVar1;
  (this->_emitterSystem)._emitterIdNumber = uVar2;
  return;
}

Assistant:

class OPENDIS6_EXPORT EmitterSystem
{
protected:
  /** Name of the emitter, 16 bit enumeration */
  unsigned short _emitterName; 

  /** function of the emitter, 8 bit enumeration */
  unsigned char _function; 

  /** emitter ID, 8 bit enumeration */
  unsigned char _emitterIdNumber; 


 public:
    EmitterSystem();
    virtual ~EmitterSystem();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned short getEmitterName() const; 
    void setEmitterName(unsigned short pX); 

    unsigned char getFunction() const; 
    void setFunction(unsigned char pX); 

    unsigned char getEmitterIdNumber() const; 
    void setEmitterIdNumber(unsigned char pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const EmitterSystem& rhs) const;
}